

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O0

Hop_Obj_t * Hop_IthVar(Hop_Man_t *p,int i)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  int local_18;
  int v;
  int i_local;
  Hop_Man_t *p_local;
  
  for (local_18 = Hop_ManPiNum(p); local_18 <= i; local_18 = local_18 + 1) {
    Hop_ObjCreatePi(p);
  }
  iVar1 = Vec_PtrSize(p->vPis);
  if (i < iVar1) {
    pHVar2 = Hop_ManPi(p,i);
    return pHVar2;
  }
  __assert_fail("i < Vec_PtrSize(p->vPis)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopOper.c"
                ,0x44,"Hop_Obj_t *Hop_IthVar(Hop_Man_t *, int)");
}

Assistant:

Hop_Obj_t * Hop_IthVar( Hop_Man_t * p, int i )
{
    int v;
    for ( v = Hop_ManPiNum(p); v <= i; v++ )
        Hop_ObjCreatePi( p );
    assert( i < Vec_PtrSize(p->vPis) );
    return Hop_ManPi( p, i );
}